

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

double __thiscall CLIntercept::log(CLIntercept *this,double __x)

{
  Services_Common *this_00;
  string *str;
  string *in_RSI;
  string logString;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  CLIntercept *local_8;
  
  if (((this->m_Config).SuppressLogging & 1U) == 0) {
    this_00 = (Services_Common *)(long)(this->m_Config).LogIndent;
    local_10 = in_RSI;
    local_8 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,(ulong)this_00,' ',&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    std::__cxx11::string::operator+=(local_30,local_10);
    if ((((this->m_Config).LogToFile & 1U) != 0) &&
       (std::operator<<((ostream *)&this->m_InterceptLog,local_30),
       ((this->m_Config).FlushFiles & 1U) != 0)) {
      std::ostream::flush();
    }
    if (((this->m_Config).LogToDebugger & 1U) != 0) {
      str = (string *)OS(this);
      ::OS::Services_Common::OutputDebugString(this_00,str);
    }
    if ((((this->m_Config).LogToFile & 1U) == 0) && (((this->m_Config).LogToDebugger & 1U) == 0)) {
      std::operator<<((ostream *)&std::cerr,local_30);
    }
    __x = (double)std::__cxx11::string::~string(local_30);
  }
  return __x;
}

Assistant:

void CLIntercept::log( const std::string& s )
{
    if( m_Config.SuppressLogging == false )
    {
        std::string logString( m_Config.LogIndent, ' ' );
        logString += s;
        if( m_Config.LogToFile )
        {
            m_InterceptLog << logString;
            if( m_Config.FlushFiles )
            {
                m_InterceptLog.flush();
            }
        }
        if( m_Config.LogToDebugger )
        {
            OS().OutputDebugString( logString );
        }

        if( ( m_Config.LogToFile == false ) &&
            ( m_Config.LogToDebugger == false ) )
        {
            std::cerr << logString;
        }
    }
}